

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

int SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  iVar3 = SMCompatible_Band(A,B);
  if (iVar3 == 0) {
    return -0x2bd;
  }
  pvVar6 = A->content;
  iVar3 = *(int *)((long)pvVar6 + 0xc);
  pvVar5 = B->content;
  iVar1 = *(int *)((long)pvVar5 + 0xc);
  if (iVar1 < iVar3) {
    iVar11 = *(int *)((long)pvVar5 + 0x10);
    iVar8 = *(int *)((long)pvVar6 + 0x10);
  }
  else {
    iVar8 = *(int *)((long)pvVar6 + 0x10);
    iVar11 = *(int *)((long)pvVar5 + 0x10);
    if (iVar8 <= iVar11) goto LAB_003c9c0b;
  }
  if (iVar8 < iVar11) {
    iVar8 = iVar11;
  }
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  iVar1 = *(int *)((long)pvVar6 + 0x14);
  if (*(int *)((long)pvVar6 + 0x14) < *(int *)((long)pvVar5 + 0x14)) {
    iVar1 = *(int *)((long)pvVar5 + 0x14);
  }
  iVar11 = iVar8 + iVar1 + 1;
  *(int *)((long)pvVar5 + 0xc) = iVar3;
  *(int *)((long)pvVar5 + 0x10) = iVar8;
  *(int *)((long)pvVar5 + 0x14) = iVar1;
  *(int *)((long)pvVar5 + 8) = iVar11;
  lVar9 = (long)*(int *)((long)pvVar5 + 4) * (long)iVar11;
  *(int *)((long)pvVar5 + 0x20) = (int)lVar9;
  pvVar5 = realloc(*(void **)((long)pvVar5 + 0x18),lVar9 * 8);
  pvVar6 = B->content;
  *(void **)((long)pvVar6 + 0x18) = pvVar5;
  lVar9 = 0;
  for (lVar7 = 0; lVar7 < *(int *)((long)pvVar6 + 4); lVar7 = lVar7 + 1) {
    *(long *)(*(long *)((long)pvVar6 + 0x28) + lVar7 * 8) = *(long *)((long)pvVar6 + 0x18) + lVar9;
    pvVar6 = B->content;
    lVar9 = lVar9 + (long)iVar11 * 8;
  }
LAB_003c9c0b:
  iVar3 = SUNMatZero_Band(B);
  uVar4 = 0xfffffd41;
  if (iVar3 == 0) {
    pvVar6 = B->content;
    uVar4 = 0;
    uVar2 = *(uint *)((long)pvVar6 + 4);
    if ((int)*(uint *)((long)pvVar6 + 4) < 1) {
      uVar2 = uVar4;
    }
    for (uVar10 = 0; uVar10 != uVar2; uVar10 = uVar10 + 1) {
      iVar3 = *(int *)((long)pvVar6 + 0x14);
      lVar9 = *(long *)(*(long *)((long)pvVar6 + 0x28) + uVar10 * 8);
      pvVar5 = A->content;
      iVar1 = *(int *)((long)pvVar5 + 0x14);
      lVar7 = *(long *)(*(long *)((long)pvVar5 + 0x28) + uVar10 * 8);
      iVar11 = *(int *)((long)pvVar5 + 0x10);
      for (lVar12 = (long)-*(int *)((long)pvVar5 + 0xc); lVar12 <= iVar11; lVar12 = lVar12 + 1) {
        *(undefined8 *)((long)iVar3 * 8 + lVar9 + lVar12 * 8) =
             *(undefined8 *)((long)iVar1 * 8 + lVar7 + lVar12 * 8);
      }
    }
  }
  return uVar4;
}

Assistant:

int SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j, colSize, ml, mu, smu;
  realtype *A_colj, *B_colj;

  /* Verify that A and B have compatible dimensions */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Grow B if A's bandwidth is larger */
  if ( (SM_UBAND_B(A) > SM_UBAND_B(B)) ||
       (SM_LBAND_B(A) > SM_LBAND_B(B)) ) {
    ml  = SUNMAX(SM_LBAND_B(B),SM_LBAND_B(A));
    mu  = SUNMAX(SM_UBAND_B(B),SM_UBAND_B(A));
    smu = SUNMAX(SM_SUBAND_B(B),SM_SUBAND_B(A));
    colSize = smu + ml + 1;
    SM_CONTENT_B(B)->mu = mu;
    SM_CONTENT_B(B)->ml = ml;
    SM_CONTENT_B(B)->s_mu = smu;
    SM_CONTENT_B(B)->ldim = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data = (realtype *)
      realloc(SM_CONTENT_B(B)->data, SM_COLUMNS_B(B) * colSize*sizeof(realtype));
    for (j=0; j<SM_COLUMNS_B(B); j++)
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
  }

  /* Perform operation */
  if (SUNMatZero_Band(B) != SUNMAT_SUCCESS)
    return SUNMAT_OPERATION_FAIL;
  for (j=0; j<SM_COLUMNS_B(B); j++) {
    B_colj = SM_COLUMN_B(B,j);
    A_colj = SM_COLUMN_B(A,j);
    for (i=-SM_UBAND_B(A); i<=SM_LBAND_B(A); i++)
      B_colj[i] = A_colj[i];
  }
  return SUNMAT_SUCCESS;
}